

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O0

void * __thiscall adios2::format::ChunkV::GetPtr(ChunkV *this,size_t OverallPosInBuffer)

{
  size_type sVar1;
  reference pvVar2;
  ulong uVar3;
  ulong in_RSI;
  long in_RDI;
  int bufferIdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_108 [16];
  unsigned_long in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string local_c8 [39];
  undefined1 local_a1 [40];
  undefined1 local_79 [56];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  ulong local_18;
  
  local_1c = 0;
  local_18 = in_RSI;
  sVar1 = std::
          vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
          ::size((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                  *)(in_RDI + 0x58));
  if (sVar1 != 0) {
    do {
      pvVar2 = std::
               vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ::operator[]((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                             *)(in_RDI + 0x58),(long)local_1c);
      if (local_18 < pvVar2->Size) {
        pvVar2 = std::
                 vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 ::operator[]((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                               *)(in_RDI + 0x58),(long)local_1c);
        if ((pvVar2->External & 1U) == 0) {
          pvVar2 = std::
                   vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   ::operator[]((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                                 *)(in_RDI + 0x58),(long)local_1c);
          return (void *)((long)pvVar2->Base + local_18);
        }
        pvVar2 = std::
                 vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 ::operator[]((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                               *)(in_RDI + 0x58),(long)local_1c);
        return (void *)((pvVar2->External & 1) + local_18);
      }
      pvVar2 = std::
               vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ::operator[]((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                             *)(in_RDI + 0x58),(long)local_1c);
      local_18 = local_18 - pvVar2->Size;
      local_1c = local_1c + 1;
      uVar3 = (ulong)local_1c;
      sVar1 = std::
              vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
              ::size((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                      *)(in_RDI + 0x58));
    } while (uVar3 <= sVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Toolkit",&local_41);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_79 + 1),"format::ChunkV",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_a1 + 1),"GetPtr",(allocator *)__rhs);
    std::__cxx11::to_string(in_stack_ffffffffffffff08);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string((string *)(local_a1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a1);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (void *)0x0;
}

Assistant:

void *ChunkV::GetPtr(size_t OverallPosInBuffer)
{
    int bufferIdx = 0;
    if (DataV.size() == 0)
        return nullptr;
    while (DataV[bufferIdx].Size <= OverallPosInBuffer)
    {
        OverallPosInBuffer -= DataV[bufferIdx].Size;
        bufferIdx++;
        if (static_cast<size_t>(bufferIdx) > DataV.size())
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "format::ChunkV", "GetPtr",
                "ChunkV::GetPtr(" + std::to_string(OverallPosInBuffer) +
                    ") refers to a non-existing or deferred memory chunk.");
            return nullptr;
        }
    }
    if (DataV[bufferIdx].External)
        return ((char *)DataV[bufferIdx].External) + OverallPosInBuffer;

    return (void *)((char *)DataV[bufferIdx].Base + OverallPosInBuffer);
}